

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerQueue.h
# Opt level: O0

void __thiscall
WorkerQueue<ReadMergerWorker<DNA>,_std::pair<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>,_WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*>
::WorkerQueue(WorkerQueue<ReadMergerWorker<DNA>,_std::pair<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>,_WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*>
              *this,int numWorkers,
             WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             *args)

{
  uint local_7c;
  type local_48;
  thread local_40;
  uint local_34;
  uint local_30;
  int i;
  uint actualWorkers;
  WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *local_20;
  WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *args_local;
  WorkerQueue<ReadMergerWorker<DNA>,_std::pair<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>,_WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*>
  *pWStack_10;
  int numWorkers_local;
  WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_local;
  
  local_20 = args;
  args_local._4_4_ = numWorkers;
  pWStack_10 = this;
  std::deque<std::thread,_std::allocator<std::thread>_>::deque
            ((deque<std::thread,_std::allocator<std::thread>_> *)this);
  std::condition_variable::condition_variable((condition_variable *)(this + 0x50));
  std::mutex::mutex((mutex *)(this + 0x80));
  std::atomic<bool>::atomic((atomic<bool> *)(this + 0xa8),false);
  std::atomic<int>::atomic((atomic<int> *)(this + 0xac),0);
  std::
  queue<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>,std::deque<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>,std::allocator<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>>>>
  ::
  queue<std::deque<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>,std::allocator<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>>>,void>
            ((queue<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>,std::deque<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>,std::allocator<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>>>>
              *)(this + 0xb0));
  *(undefined8 *)(this + 0x100) = 0;
  *(undefined8 *)(this + 0x108) = 0;
  std::
  deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
  ::deque((deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
           *)(this + 0x110));
  if ((int)args_local._4_4_ < 1) {
    local_7c = std::thread::hardware_concurrency();
  }
  else {
    local_7c = args_local._4_4_;
  }
  local_30 = local_7c;
  for (local_34 = 0; local_34 < local_30; local_34 = local_34 + 1) {
    local_48.this =
         (WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *)this;
    std::thread::
    thread<WorkerQueue<ReadMergerWorker<DNA>,std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>,WorkerQueue<MergedReadWriterWorker<DNA>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::__cxx11::string_const&>*>::WorkerQueue(int,WorkerQueue<MergedReadWriterWorker<DNA>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::__cxx11::string_const&>*)::_lambda(WorkerQueue<MergedReadWriterWorker<DNA>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::__cxx11::string_const&>*&&)_1_,WorkerQueue<MergedReadWriterWorker<DNA>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::__cxx11::string_const&>*&,void>
              (&local_40,&local_48,&local_20);
    std::deque<std::thread,_std::allocator<std::thread>_>::push_back
              ((deque<std::thread,_std::allocator<std::thread>_> *)this,&local_40);
    std::thread::~thread(&local_40);
  }
  return;
}

Assistant:

WorkerQueue( const int numWorkers = 1, Args... args )
      : mStop( false ), mWorkingCount( 0 ), mTotalEnqueued( 0 ),
        mTotalProcessed( 0 ) {
    auto actualWorkers =
      numWorkers <= 0 ? std::thread::hardware_concurrency() : numWorkers;

    for( int i = 0; i < actualWorkers; i++ ) {
      mWorkers.push_back( std::thread(
        [this]( Args&&... args ) {
          this->WorkerLoop( std::forward< Args >( args )... );
        },
        args... ) );
    }
  }